

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

void __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  UserGeometry *pUVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  char cVar8;
  uint uVar9;
  runtime_error *prVar10;
  uint uVar11;
  size_t i;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  task_group_context *in_stack_fffffffffffffeb8;
  undefined8 uStack_140;
  BBox3fa centBounds;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  anon_class_8_1_8991fb9c calculateCentBounds;
  anon_class_8_1_898bcfc2 local_f0;
  blocked_range<unsigned_int> local_e8;
  BBox3fa box;
  MortonCodeMapping mapping;
  
  uVar9 = current->_begin;
  uVar12 = (ulong)uVar9;
  uVar11 = current->_end;
  if (uVar11 - uVar9 < 0x400) {
    auVar20._8_4_ = 0xff800000;
    auVar20._0_8_ = 0xff800000ff800000;
    auVar20._12_4_ = 0xff800000;
    auVar13._8_4_ = 0x7f800000;
    in_stack_fffffffffffffeb8 = (task_group_context *)0x7f8000007f800000;
    auVar13._12_4_ = 0x7f800000;
    for (; uVar12 < uVar11; uVar12 = uVar12 + 1) {
      pUVar1 = this->calculateBounds->mesh;
      centBounds.lower.field_0.m128[2] = (float)this->morton[uVar12].field_0.field_0.index;
      centBounds.lower.field_0._0_8_ = (pUVar1->super_AccelSet).super_Geometry.userPtr;
      centBounds.lower.field_0.m128[3] = 0.0;
      centBounds.upper.field_0._0_8_ = &box;
      (**(code **)&(pUVar1->super_AccelSet).super_Geometry.field_0x58)(&centBounds);
      auVar14._0_4_ = box.lower.field_0.m128[0] + box.upper.field_0.m128[0];
      auVar14._4_4_ = box.lower.field_0.m128[1] + box.upper.field_0.m128[1];
      auVar14._8_4_ = box.lower.field_0.m128[2] + box.upper.field_0.m128[2];
      auVar14._12_4_ = box.lower.field_0.m128[3] + box.upper.field_0.m128[3];
      auVar13 = vminps_avx(auVar13,auVar14);
      auVar20 = vmaxps_avx(auVar20,auVar14);
      uVar11 = current->_end;
    }
    auVar22 = vsubps_avx(auVar20,auVar13);
    auVar21._8_4_ = 0x1fec1e4a;
    auVar21._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar21._12_4_ = 0x1fec1e4a;
    auVar2 = vcmpps_avx(auVar22,auVar21,6);
    auVar7 = vrcpps_avx(auVar22);
    fVar3 = auVar7._0_4_;
    auVar15._0_4_ = auVar22._0_4_ * fVar3;
    fVar4 = auVar7._4_4_;
    auVar15._4_4_ = auVar22._4_4_ * fVar4;
    fVar5 = auVar7._8_4_;
    auVar15._8_4_ = auVar22._8_4_ * fVar5;
    fVar6 = auVar7._12_4_;
    auVar15._12_4_ = auVar22._12_4_ * fVar6;
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    auVar7 = vsubps_avx(auVar29,auVar15);
    auVar16._0_4_ = (fVar3 + fVar3 * auVar7._0_4_) * 1013.76;
    auVar16._4_4_ = (fVar4 + fVar4 * auVar7._4_4_) * 1013.76;
    auVar16._8_4_ = (fVar5 + fVar5 * auVar7._8_4_) * 1013.76;
    auVar16._12_4_ = (fVar6 + fVar6 * auVar7._12_4_) * 1013.76;
    auVar2 = vandps_avx(auVar2,auVar16);
    uVar12 = (ulong)current->_begin;
    while( true ) {
      if (uVar11 <= uVar12) break;
      pUVar1 = this->calculateBounds->mesh;
      centBounds.lower.field_0.m128[2] = (float)this->morton[uVar12].field_0.field_0.index;
      centBounds.lower.field_0._0_8_ = (pUVar1->super_AccelSet).super_Geometry.userPtr;
      centBounds.lower.field_0.m128[3] = 0.0;
      centBounds.upper.field_0._0_8_ = &box;
      (**(code **)&(pUVar1->super_AccelSet).super_Geometry.field_0x58)(&centBounds);
      auVar17._0_4_ = box.lower.field_0.m128[0] + box.upper.field_0.m128[0];
      auVar17._4_4_ = box.lower.field_0.m128[1] + box.upper.field_0.m128[1];
      auVar17._8_4_ = box.lower.field_0.m128[2] + box.upper.field_0.m128[2];
      auVar17._12_4_ = box.lower.field_0.m128[3] + box.upper.field_0.m128[3];
      auVar7 = vsubps_avx(auVar17,auVar13);
      local_118 = auVar2._0_4_;
      fStack_114 = auVar2._4_4_;
      fStack_110 = auVar2._8_4_;
      fStack_10c = auVar2._12_4_;
      auVar18._0_4_ = auVar7._0_4_ * local_118;
      auVar18._4_4_ = auVar7._4_4_ * fStack_114;
      auVar18._8_4_ = auVar7._8_4_ * fStack_110;
      auVar18._12_4_ = auVar7._12_4_ * fStack_10c;
      auVar7 = vcvtps2dq_avx(auVar18);
      uVar9 = vextractps_avx(auVar7,1);
      auVar7 = vshufps_avx(auVar7,auVar7,0xe8);
      auVar22 = vpslld_avx(auVar7,0x10);
      auVar7 = vpor_avx(auVar22,auVar7);
      auVar23._8_4_ = 0x30000ff;
      auVar23._0_8_ = 0x30000ff030000ff;
      auVar23._12_4_ = 0x30000ff;
      auVar7 = vpand_avx(auVar7,auVar23);
      auVar24._8_4_ = 0x101;
      auVar24._0_8_ = 0x10100000101;
      auVar24._12_4_ = 0x101;
      auVar7 = vpmulld_avx(auVar7,auVar24);
      auVar25._8_4_ = 0x300f00f;
      auVar25._0_8_ = 0x300f00f0300f00f;
      auVar25._12_4_ = 0x300f00f;
      auVar7 = vpand_avx(auVar7,auVar25);
      auVar26._8_4_ = 0x11;
      auVar26._0_8_ = 0x1100000011;
      auVar26._12_4_ = 0x11;
      auVar7 = vpmulld_avx(auVar7,auVar26);
      auVar27._8_4_ = 0x30c30c3;
      auVar27._0_8_ = 0x30c30c3030c30c3;
      auVar27._12_4_ = 0x30c30c3;
      auVar7 = vpand_avx(auVar7,auVar27);
      auVar7 = vpmulld_avx(auVar7,_DAT_01f820b0);
      auVar7 = vpand_avx(auVar7,_DAT_01f820c0);
      this->morton[uVar12].field_0.field_0.code =
           auVar7._4_4_ |
           auVar7._0_4_ |
           ((((uVar9 << 0x10 | uVar9) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 10 &
           0x12492492;
      uVar12 = uVar12 + 1;
      uVar11 = current->_end;
    }
    std::__sort<embree::avx::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
              (this->morton + current->_begin,this->morton + uVar11);
  }
  else {
    mapping.base.field_0.i[2] = 0x7f800000;
    mapping.base.field_0._0_8_ = 0x7f8000007f800000;
    mapping.base.field_0.i[3] = 0x7f800000;
    mapping.scale.field_0.i[2] = 0xff800000;
    mapping.scale.field_0._0_8_ = 0xff800000ff800000;
    mapping.scale.field_0.i[3] = 0xff800000;
    calculateCentBounds.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&box,(context_traits)0x4,CUSTOM_CTX);
    local_e8.my_begin = uVar9;
    local_e8.my_end = uVar11;
    local_e8.my_grainsize = 0x400;
    local_108._0_8_ = BBox<embree::Vec3fa>::merge;
    local_108._8_8_ = &calculateCentBounds;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_int>,embree::BBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_int,embree::BBox<embree::Vec3fa>,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::avx::SetBVHNBounds<8>,embree::avx::CreateMortonLeaf<8,embree::Object>,embree::avx::CalculateMeshBounds<embree::UserGeometry>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>(unsigned_int,unsigned_int,unsigned_int,embree::BBox<embree::Vec3fa>const&,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::avx::SetBVHNBounds<8>,embree::avx::CreateMortonLeaf<8,embree::Object>,embree::avx::CalculateMeshBounds<embree::UserGeometry>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_1_const&,embree::BBox<embree::Vec3fa>const(const&)(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&,embree::BBox<embree::Vec3fa>const&)_1_,embree::BBox<embree::Vec3fa>const(embree::BBox<embree::Vec3fa>const&,embree::BBox<embree::Vec3fa>const&)>
              (&centBounds,(d1 *)&local_e8,(blocked_range<unsigned_int> *)&mapping,
               (BBox<embree::Vec3fa> *)local_108,
               (anon_class_16_2_ed117de8_conflict24 *)BBox<embree::Vec3fa>::merge,
               (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)&box,
               in_stack_fffffffffffffeb8);
    cVar8 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&box);
    if (cVar8 != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"task cancelled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&box);
    auVar2._8_4_ = centBounds.lower.field_0.m128[2];
    auVar2._0_8_ = centBounds.lower.field_0._0_8_;
    auVar2._12_4_ = centBounds.lower.field_0.m128[3];
    auVar7._8_8_ = centBounds.upper.field_0._8_8_;
    auVar7._0_8_ = centBounds.upper.field_0._0_8_;
    auVar7 = vsubps_avx(auVar7,auVar2);
    auVar28._8_4_ = 0x1fec1e4a;
    auVar28._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar28._12_4_ = 0x1fec1e4a;
    auVar13 = vcmpps_avx(auVar7,auVar28,6);
    auVar2 = vrcpps_avx(auVar7);
    fVar3 = auVar2._0_4_;
    auVar22._0_4_ = auVar7._0_4_ * fVar3;
    fVar4 = auVar2._4_4_;
    auVar22._4_4_ = auVar7._4_4_ * fVar4;
    fVar5 = auVar2._8_4_;
    auVar22._8_4_ = auVar7._8_4_ * fVar5;
    fVar6 = auVar2._12_4_;
    auVar22._12_4_ = auVar7._12_4_ * fVar6;
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    auVar2 = vsubps_avx(auVar30,auVar22);
    auVar19._0_4_ = (fVar3 + fVar3 * auVar2._0_4_) * 1013.76;
    auVar19._4_4_ = (fVar4 + fVar4 * auVar2._4_4_) * 1013.76;
    auVar19._8_4_ = (fVar5 + fVar5 * auVar2._8_4_) * 1013.76;
    auVar19._12_4_ = (fVar6 + fVar6 * auVar2._12_4_) * 1013.76;
    mapping.scale.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vandps_avx(auVar13,auVar19);
    uStack_140 = 0;
    auVar13._0_4_ = current->_begin;
    auVar13._4_4_ = current->_end;
    local_108._0_8_ = this;
    local_108._8_8_ = &mapping;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&box,(context_traits)0x4,CUSTOM_CTX);
    auVar13 = vpermilps_avx(auVar13,0xe1);
    local_e8._0_8_ = vmovlps_avx(auVar13);
    local_e8.my_grainsize = 0x400;
    local_f0.func = (anon_class_16_2_00173b7b *)local_108;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_int>,embree::parallel_for<unsigned_int,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::avx::SetBVHNBounds<8>,embree::avx::CreateMortonLeaf<8,embree::Object>,embree::avx::CalculateMeshBounds<embree::UserGeometry>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_>(unsigned_int,unsigned_int,unsigned_int,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create,embree::avx::SetBVHNBounds<8>,embree::avx::CreateMortonLeaf<8,embree::Object>,embree::avx::CalculateMeshBounds<embree::UserGeometry>,embree::Scene::BuildProgressMonitorInterface>::recreateMortonCodes(embree::range<unsigned_int>const&)const::_lambda(embree::range<unsigned_int>const&)_2_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_int>const&)_1_>
              (&local_e8,&local_f0,(task_group_context *)&box);
    cVar8 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&box);
    if (cVar8 != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"task cancelled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&box);
    tbb::detail::d1::parallel_sort<embree::avx::BVHBuilderMorton::BuildPrim*>
              (this->morton + current->_begin,this->morton + current->_end);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }